

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O0

int secp256k1_keypair_seckey_load
              (secp256k1_context *ctx,secp256k1_scalar *sk,secp256k1_keypair *keypair)

{
  secp256k1_callback *in_RDX;
  secp256k1_context *in_RDI;
  int ret;
  uint in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  int local_4;
  
  local_4 = secp256k1_scalar_set_b32_seckey
                      ((secp256k1_scalar *)in_RDX,
                       (uchar *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  secp256k1_declassify(in_RDI,&stack0xffffffffffffffdc,4);
  if (local_4 == 0) {
    secp256k1_callback_call(in_RDX,(char *)(ulong)in_stack_ffffffffffffffd8);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int secp256k1_keypair_seckey_load(const secp256k1_context* ctx, secp256k1_scalar *sk, const secp256k1_keypair *keypair) {
    int ret;

    ret = secp256k1_scalar_set_b32_seckey(sk, &keypair->data[0]);
    /* We can declassify ret here because sk is only zero if a keypair function
     * failed (which zeroes the keypair) and its return value is ignored. */
    secp256k1_declassify(ctx, &ret, sizeof(ret));
    ARG_CHECK(ret);
    return ret;
}